

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

Future<int> * __thiscall
Omega_h::Mesh::isync_array<int>
          (Future<int> *__return_storage_ptr__,Mesh *this,Int ent_dim,Read<int> *a,Int width)

{
  bool bVar1;
  Read<int> local_180;
  Dist local_170;
  Dist local_e0;
  Read<int> local_40;
  Int local_2c;
  Read<int> *pRStack_28;
  Int width_local;
  Read<int> *a_local;
  Mesh *pMStack_18;
  Int ent_dim_local;
  Mesh *this_local;
  
  local_2c = width;
  pRStack_28 = a;
  a_local._4_4_ = ent_dim;
  pMStack_18 = this;
  this_local = (Mesh *)__return_storage_ptr__;
  bVar1 = could_be_shared(this,ent_dim);
  if (bVar1) {
    ask_dist(&local_170,this,a_local._4_4_);
    Dist::invert(&local_e0,&local_170);
    Read<int>::Read(&local_180,a);
    Dist::iexch<int>(__return_storage_ptr__,&local_e0,&local_180,local_2c);
    Read<int>::~Read(&local_180);
    Dist::~Dist(&local_e0);
    Dist::~Dist(&local_170);
  }
  else {
    Read<int>::Read(&local_40,a);
    Future<int>::Future(__return_storage_ptr__,&local_40);
    Read<int>::~Read(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Future<T> Mesh::isync_array(Int ent_dim, Read<T> a, Int width) {
  if (!could_be_shared(ent_dim)) {
    return Future<T>(a);
  }
  return ask_dist(ent_dim).invert().iexch(a, width);
}